

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

ptr<Statement> __thiscall Parser::forStatement(Parser *this)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Parser *in_RSI;
  ptr<Statement> pVar3;
  Identifier identifier;
  ptr<StatementBlock> statBlock;
  ptr<Expression> iterable;
  undefined1 local_99;
  _Alloc_hider local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  shared_ptr<StatementBlock> local_68;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  _Alloc_hider _Stack_38;
  unsigned_long local_30;
  undefined8 uStack_28;
  
  consume(in_RSI);
  local_58._0_4_ = (in_RSI->currentToken).type;
  pcVar1 = (in_RSI->currentToken).lexeme._M_dataplus._M_p;
  local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_58 + 8),pcVar1,pcVar1 + (in_RSI->currentToken).lexeme._M_string_length
            );
  local_30 = (in_RSI->currentToken).line;
  uStack_28 = (in_RSI->currentToken).col;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8)) {
    local_88.field_2._8_8_ = _Stack_38._M_p;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  }
  else {
    local_88._M_dataplus._M_p = (pointer)local_58._8_8_;
  }
  local_88.field_2._M_allocated_capacity = local_48._8_8_;
  local_88._M_string_length = local_48._0_8_;
  consume(in_RSI,Identifier,"identifier");
  consume(in_RSI,In,"\'in\'");
  expression((Parser *)local_58);
  in_RSI->functionCounter = in_RSI->functionCounter + 1;
  statementBlock((Parser *)&local_68);
  in_RSI->functionCounter = in_RSI->functionCounter + -1;
  local_98._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ForStatement,std::allocator<ForStatement>,std::__cxx11::string&,std::shared_ptr<Expression>&,std::shared_ptr<StatementBlock>&>
            (&local_90,(ForStatement **)&local_98,(allocator<ForStatement> *)&local_99,&local_88,
             (shared_ptr<Expression> *)local_58,&local_68);
  _Var2._M_pi = local_90._M_pi;
  (this->filepath)._M_dataplus._M_p = local_98._M_p;
  (this->filepath)._M_string_length = 0;
  local_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->filepath)._M_string_length = (size_type)_Var2._M_pi;
  _Var2._M_pi = extraout_RDX;
  if (local_68.super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var2._M_pi = extraout_RDX_00;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
    _Var2._M_pi = extraout_RDX_01;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    _Var2._M_pi = extraout_RDX_02;
  }
  pVar3.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  pVar3.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Statement>)pVar3.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Statement> Parser::forStatement() {
    consume();
    Identifier identifier = token().lexeme;
    consume(TokenType::Identifier, "identifier");

    consume(TokenType::In, "'in'");

    ptr<Expression> iterable = expression();

    functionCounter++;
    ptr<StatementBlock> statBlock = statementBlock();
    functionCounter--;

    return make<ForStatement>(identifier, iterable, statBlock);
}